

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::pair<long,_long>,_10>::Resize
          (TPZManVector<std::pair<long,_long>,_10> *this,int64_t newsize,pair<long,_long> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pair<long,_long> *ppVar3;
  undefined8 uVar4;
  long lVar5;
  ostream *poVar6;
  pair<long,_long> *ppVar7;
  pair<long,_long> *ppVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  if (newsize < 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<std::pair<long,_long>_>).fNElements;
  if (lVar9 != newsize) {
    lVar10 = (this->super_TPZVec<std::pair<long,_long>_>).fNAlloc;
    if (lVar10 < newsize) {
      if ((ulong)newsize < 0xb) {
        ppVar3 = (this->super_TPZVec<std::pair<long,_long>_>).fStore;
        ppVar7 = this->fExtAlloc;
        lVar5 = 0;
        lVar10 = lVar9;
        if (lVar9 < 1) {
          lVar9 = lVar5;
          lVar10 = lVar5;
        }
        while (lVar9 != 0) {
          puVar1 = (undefined8 *)((long)&ppVar3->first + lVar5);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)&ppVar7->first + lVar5);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar5 = lVar5 + 0x10;
          lVar9 = lVar9 + -1;
        }
        ppVar8 = this->fExtAlloc + lVar10;
        for (; lVar10 < newsize; lVar10 = lVar10 + 1) {
          lVar9 = object->second;
          ppVar8->first = object->first;
          ppVar8->second = lVar9;
          ppVar8 = ppVar8 + 1;
        }
        if (ppVar3 != (pair<long,_long> *)0x0 && ppVar3 != ppVar7) {
          operator_delete__(ppVar3);
        }
        (this->super_TPZVec<std::pair<long,_long>_>).fStore = ppVar7;
        (this->super_TPZVec<std::pair<long,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<long,_long>_>).fNAlloc = 10;
      }
      else {
        dVar12 = (double)lVar10 * 1.2;
        uVar11 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar11 = newsize;
        }
        ppVar7 = (pair<long,_long> *)operator_new__(-(ulong)(uVar11 >> 0x3c != 0) | uVar11 << 4);
        if (uVar11 != 0) {
          memset(ppVar7,0,uVar11 << 4);
        }
        ppVar3 = (this->super_TPZVec<std::pair<long,_long>_>).fStore;
        lVar5 = 0;
        lVar10 = lVar9;
        if (lVar9 < 1) {
          lVar9 = lVar5;
          lVar10 = lVar5;
        }
        while (lVar9 != 0) {
          puVar1 = (undefined8 *)((long)&ppVar3->first + lVar5);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)&ppVar7->first + lVar5);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar5 = lVar5 + 0x10;
          lVar9 = lVar9 + -1;
        }
        lVar9 = object->first;
        lVar5 = object->second;
        ppVar8 = ppVar7 + lVar10;
        for (; lVar10 < newsize; lVar10 = lVar10 + 1) {
          ppVar8->first = lVar9;
          ppVar8->second = lVar5;
          ppVar8 = ppVar8 + 1;
        }
        if (ppVar3 != (pair<long,_long> *)0x0 && ppVar3 != this->fExtAlloc) {
          operator_delete__(ppVar3);
        }
        (this->super_TPZVec<std::pair<long,_long>_>).fStore = ppVar7;
        (this->super_TPZVec<std::pair<long,_long>_>).fNElements = newsize;
        (this->super_TPZVec<std::pair<long,_long>_>).fNAlloc = uVar11;
      }
    }
    else {
      ppVar7 = (this->super_TPZVec<std::pair<long,_long>_>).fStore + lVar9;
      for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
        lVar10 = object->second;
        ppVar7->first = object->first;
        ppVar7->second = lVar10;
        ppVar7 = ppVar7 + 1;
      }
      (this->super_TPZVec<std::pair<long,_long>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}